

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O1

duckdb_state duckdb_appender_destroy(duckdb_appender *appender)

{
  duckdb_appender p_Var1;
  duckdb_state dVar2;
  pointer *__ptr;
  
  dVar2 = DuckDBError;
  if ((appender != (duckdb_appender *)0x0) && (*appender != (duckdb_appender)0x0)) {
    dVar2 = duckdb_appender_close(*appender);
    p_Var1 = *appender;
    if (p_Var1 != (duckdb_appender)0x0) {
      if (*(duckdb_appender *)(p_Var1 + 8) != p_Var1 + 0x18) {
        operator_delete(*(duckdb_appender *)(p_Var1 + 8));
      }
      if (*(long **)p_Var1 != (long *)0x0) {
        (**(code **)(**(long **)p_Var1 + 8))();
      }
      *(long *)p_Var1 = 0;
      operator_delete(p_Var1);
    }
    *appender = (duckdb_appender)0x0;
  }
  return dVar2;
}

Assistant:

duckdb_state duckdb_appender_destroy(duckdb_appender *appender) {
	if (!appender || !*appender) {
		return DuckDBError;
	}
	auto state = duckdb_appender_close(*appender);
	auto wrapper = reinterpret_cast<AppenderWrapper *>(*appender);
	if (wrapper) {
		delete wrapper;
	}
	*appender = nullptr;
	return state;
}